

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,TPZGeoBlend<pzgeom::TPZGeoCube> *cp,
          TPZGeoMesh *destmesh)

{
  TPZGeoEl *pTVar1;
  long in_RSI;
  TPZRegisterClassId *in_RDI;
  int is;
  int64_t gelindex;
  size_t in_stack_00000338;
  char *in_stack_00000340;
  TPZTransform<double> *in_stack_ffffffffffffff18;
  TPZGeoMesh *in_stack_ffffffffffffff20;
  TPZGeoMesh *in_stack_ffffffffffffff28;
  TPZGeoCube *in_stack_ffffffffffffff30;
  void **in_stack_ffffffffffffff38;
  TPZTransform<double> *in_stack_ffffffffffffff40;
  TPZRegisterClassId *local_78;
  TPZRegisterClassId *local_50;
  int local_44;
  
  TPZRegisterClassId::TPZRegisterClassId<pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>>(in_RDI,0x21);
  TPZGeoCube::TPZGeoCube
            ((TPZGeoCube *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *(undefined ***)in_RDI = &PTR__TPZGeoBlend_0244fea0;
  local_50 = in_RDI + 0x50;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff20);
    local_50 = local_50 + 0x18;
  } while (local_50 != in_RDI + 0x230);
  local_78 = in_RDI + 0x230;
  do {
    TPZTransform<double>::TPZTransform(in_stack_ffffffffffffff40);
    local_78 = local_78 + 0x1a0;
  } while (local_78 != in_RDI + 0x22b0);
  TPZGeoEl::Index(*(TPZGeoEl **)(in_RSI + 0x48));
  for (local_44 = 0; local_44 < 0x14; local_44 = local_44 + 1) {
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_44 * 0x18 + 0x50),
               (TPZGeoElSideIndex *)(in_RSI + 0x50 + (long)local_44 * 0x18));
    TPZTransform<double>::operator=
              ((TPZTransform<double> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  pTVar1 = TPZGeoMesh::Element(in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18);
  *(TPZGeoEl **)(in_RDI + 0x48) = pTVar1;
  if (*(long *)(in_RDI + 0x48) == 0) {
    pzinternal::DebugStopImpl(in_stack_00000340,in_stack_00000338);
  }
  return;
}

Assistant:

pzgeom::TPZGeoBlend<TGeo>::TPZGeoBlend(const TPZGeoBlend<TGeo> &cp, TPZGeoMesh &destmesh) : TPZRegisterClassId(&TPZGeoBlend<TGeo>::ClassId), TGeo(cp,destmesh)
{
    int64_t gelindex = cp.fGeoEl->Index();
    for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
        fNeighbours[is] =  cp.fNeighbours[is];
        fTrans[is] =  cp.fTrans[is];
    }
    fGeoEl = destmesh.Element(gelindex);
    if(!fGeoEl) DebugStop();
}